

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewAttribute::DataViewAttribute(DataViewAttribute *this,Element *element)

{
  String local_38;
  Element *local_18;
  Element *element_local;
  DataViewAttribute *this_local;
  
  local_18 = element;
  element_local = (Element *)this;
  ::std::__cxx11::string::string((string *)&local_38);
  DataViewCommon::DataViewCommon(&this->super_DataViewCommon,element,&local_38,0);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewAttribute_00815448;
  return;
}

Assistant:

DataViewAttribute::DataViewAttribute(Element* element) : DataViewCommon(element) {}